

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPFakeTransmitter::ClearIgnoreList(RTPFakeTransmitter *this)

{
  RTPFakeTransmitter *this_local;
  
  if ((((this->init & 1U) != 0) && ((this->created & 1U) != 0)) && (this->receivemode == IgnoreSome)
     ) {
    ClearAcceptIgnoreInfo(this);
  }
  return;
}

Assistant:

void RTPFakeTransmitter::ClearIgnoreList()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created && receivemode == RTPTransmitter::IgnoreSome)
		ClearAcceptIgnoreInfo();
	MAINMUTEX_UNLOCK
}